

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyvalues.cpp
# Opt level: O0

void __thiscall KV::KeyValues::saveToBuffer(KeyValues *this,string *out)

{
  bool bVar1;
  KeyValues *this_00;
  string local_248 [32];
  multimap_iterator local_228;
  KeyValues *local_220;
  KeyValues *kv;
  multimap_iterator local_208;
  iterator __end1;
  iterator __begin1;
  KeyValues *__range1;
  anon_class_32_4_cd4c352e writeSectionRecursive;
  anon_class_16_2_01948639 writeKV;
  anon_class_16_2_b6bd5efa writeKey;
  anon_class_8_1_3fcf671e writeTabs;
  stringstream ss;
  KeyValues *root;
  string *out_local;
  KeyValues *this_local;
  
  this_00 = getRoot(this);
  bVar1 = isEmpty(this_00);
  if (!bVar1) {
    std::__cxx11::stringstream::stringstream((stringstream *)&writeTabs);
    writeKey.ss = (stringstream *)&writeTabs;
    writeKV.ss = (stringstream *)&writeKey.ss;
    writeKey.writeTabs = &writeTabs;
    writeSectionRecursive.writeKV = (anon_class_16_2_01948639 *)&writeKV.ss;
    writeKV.writeKey = (anon_class_16_2_b6bd5efa *)&writeTabs;
    __range1 = (KeyValues *)&writeKV.ss;
    writeSectionRecursive.writeKey = (anon_class_16_2_b6bd5efa *)&writeTabs;
    writeSectionRecursive.ss = (stringstream *)&writeKey.ss;
    writeSectionRecursive.writeTabs = (anon_class_8_1_3fcf671e *)&writeSectionRecursive.writeKV;
    __end1 = begin(this_00);
    local_208._M_node = (_Base_ptr)end(this_00);
    while (bVar1 = iterator::operator!=(&__end1,(iterator *)&local_208), bVar1) {
      local_220 = iterator::operator*(&__end1);
      bVar1 = isSection(local_220);
      if (bVar1) {
        saveToBuffer::anon_class_32_4_cd4c352e::operator()
                  ((anon_class_32_4_cd4c352e *)&__range1,local_220);
      }
      else {
        saveToBuffer::anon_class_16_2_01948639::operator()
                  ((anon_class_16_2_01948639 *)&writeSectionRecursive.writeKV,local_220);
      }
      local_228._M_node = (_Base_ptr)iterator::operator++(&__end1);
    }
    std::__cxx11::stringstream::str();
    std::__cxx11::string::operator=((string *)out,local_248);
    std::__cxx11::string::~string(local_248);
    std::__cxx11::stringstream::~stringstream((stringstream *)&writeTabs);
  }
  return;
}

Assistant:

void KeyValues::saveToBuffer( std::string &out )
	{
		KeyValues &root = getRoot();

		if ( root.isEmpty() )
			return;

		std::stringstream ss;

		auto writeTabs = [ &ss ]( size_t tabDepth )
		{
			if ( tabDepth > 0 )
			{
				std::string tabs( tabDepth, '\t' );
				ss << tabs;
			}
		};

		auto writeKey = [ & ]( KeyValues &kv )
		{
			writeTabs( kv.getDepth() );
			ss << '\"' << kv.getKey() << '\"';
		};

		auto writeKV = [ & ]( KeyValues &kv )
		{
			writeKey( kv );
			ss << ' ' << '\"' << kv.getValue() << '\"' << '\n';
		};

		auto writeSectionRecursive = [ & ]( KeyValues &section ) -> void
		{
			auto writeSection = [ & ]( KeyValues &sectionKV, auto &writeFunc ) -> void
			{
				writeKey( sectionKV );

				ss << '\n';
				writeTabs( sectionKV.getDepth() );
				ss << '{' << '\n';

				for ( KeyValues &kv : sectionKV )
				{
					if ( kv.isSection() )
						writeFunc( kv, writeFunc );
					else
						writeKV( kv );
				}

				writeTabs( sectionKV.getDepth() );
				ss << '}' << '\n';

				// Write a new line if it's the end of a 'global' section
				if ( sectionKV.getDepth() == 0 )
					ss << '\n';
			};

			writeSection( section, writeSection );
		};

		for ( KeyValues &kv : root )
		{
			if ( kv.isSection() )
				writeSectionRecursive( kv );
			else
				writeKV( kv );
		}

		out = ss.str();
	}